

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O1

asn_enc_rval_t *
NativeEnumerated_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  uint32_t bits;
  uint32_t bits_00;
  long lVar4;
  asn_INTEGER_enum_map_t key;
  long local_48 [3];
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
LAB_00141473:
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  else {
    plVar1 = (long *)td->specifics;
    if (((plVar1 != (long *)0x0) &&
        (((constraints != (asn_per_constraints_t *)0x0 ||
          (constraints = td->per_constraints, constraints != (asn_per_constraints_t *)0x0)) &&
         (local_48[0] = *sptr, -1 < local_48[0])))) &&
       (pvVar3 = bsearch(local_48,(void *)*plVar1,(long)(int)plVar1[2],0x18,
                         NativeEnumerated__compar_value2enum), pvVar3 != (void *)0x0)) {
      lVar4 = ((long)pvVar3 - *plVar1 >> 3) * -0x5555555555555555;
      if ((constraints->value).range_bits < 0) {
        bits = 0;
      }
      else {
        if (*(int *)((long)plVar1 + 0x14) == 0) {
          iVar2 = (int)plVar1[2];
        }
        else {
          iVar2 = *(int *)((long)plVar1 + 0x14) + -1;
        }
        bits = (uint32_t)(iVar2 <= lVar4);
      }
      if (((constraints->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
        if (bits == 0) {
LAB_001414cb:
          bits_00 = (uint32_t)lVar4;
          if ((constraints == (asn_per_constraints_t *)0x0) ||
             (iVar2 = (constraints->value).range_bits, iVar2 < 0)) {
            if (*(int *)((long)plVar1 + 0x14) == 0) goto LAB_001414fe;
            iVar2 = *(int *)((long)plVar1 + 0x14) + -1;
            if (bits == 0) {
              iVar2 = 0;
            }
            iVar2 = uper_put_nsnnwn(po,bits_00 - iVar2);
          }
          else {
            iVar2 = per_put_few_bits(po,bits_00,iVar2);
          }
          if (iVar2 == 0) {
            __return_storage_ptr__->encoded = 0;
            __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
            goto LAB_00141473;
          }
        }
      }
      else {
        iVar2 = per_put_few_bits(po,bits,1);
        if (iVar2 == 0) {
          if (bits != 0) {
            constraints = (asn_per_constraints_t *)0x0;
          }
          goto LAB_001414cb;
        }
      }
    }
LAB_001414fe:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NativeEnumerated_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_INTEGER_specifics_t *specs = (asn_INTEGER_specifics_t *)td->specifics;
	asn_enc_rval_t er;
	long native, value;
	asn_per_constraint_t *ct;
	int inext = 0;
	asn_INTEGER_enum_map_t key;
	const asn_INTEGER_enum_map_t *kf;

	if(!sptr) ASN__ENCODE_FAILED;
	if(!specs) ASN__ENCODE_FAILED;

	if(constraints) ct = &constraints->value;
	else if(td->per_constraints) ct = &td->per_constraints->value;
	else ASN__ENCODE_FAILED;	/* Mandatory! */

	ASN_DEBUG("Encoding %s as NativeEnumerated", td->name);

	er.encoded = 0;

	native = *(long *)sptr;
	if(native < 0) ASN__ENCODE_FAILED;

	key.nat_value = native;
	kf = bsearch(&key, specs->value2enum, specs->map_count,
		sizeof(key), NativeEnumerated__compar_value2enum);
	if(!kf) {
		ASN_DEBUG("No element corresponds to %ld", native);
		ASN__ENCODE_FAILED;
	}
	value = kf - specs->value2enum;

	if(ct->range_bits >= 0) {
		int cmpWith = specs->extension
				? specs->extension - 1 : specs->map_count;
		if(value >= cmpWith)
			inext = 1;
	}
	if(ct->flags & APC_EXTENSIBLE) {
		if(per_put_few_bits(po, inext, 1))
			ASN__ENCODE_FAILED;
		if(inext) ct = 0;
	} else if(inext) {
		ASN__ENCODE_FAILED;
	}

	if(ct && ct->range_bits >= 0) {
		if(per_put_few_bits(po, value, ct->range_bits))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	if(!specs->extension)
		ASN__ENCODE_FAILED;

	/*
	 * X.691, #10.6: normally small non-negative whole number;
	 */
	ASN_DEBUG("value = %ld, ext = %d, inext = %d, res = %ld",
		value, specs->extension, inext,
		value - (inext ? (specs->extension - 1) : 0));
	if(uper_put_nsnnwn(po, value - (inext ? (specs->extension - 1) : 0)))
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}